

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O2

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::AddressTableEntry>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::AddressTableEntry> *this,AddressTableEntry *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  ZoneTreeNode *pZVar1;
  ulong uVar2;
  ZoneTreeNode *pZVar3;
  ulong uVar4;
  byte *pbVar5;
  AddressTableEntry *pAVar6;
  ZoneTreeNode *pZVar7;
  AddressTableEntry *pAVar8;
  AddressTableEntry *pAVar9;
  ZoneTreeNode *root;
  ZoneTreeNode head;
  undefined8 local_40;
  AddressTableEntry *local_38;
  
  if (1 < *(ulong *)node) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/../core/zonetree.h"
               ,0x96,"!node->hasLeft()");
  }
  if (*(long *)(node + 8) == 0) {
    if (*(ulong *)node == 0) {
      pAVar9 = *(AddressTableEntry **)this;
      if (pAVar9 == (AddressTableEntry *)0x0) {
        *(AddressTableEntry **)this = node;
      }
      else {
        pZVar7 = (ZoneTreeNode *)&local_40;
        local_40 = 0;
        local_38 = pAVar9;
        *(undefined8 *)node = 1;
        uVar2 = 0;
        uVar4 = 0;
        pAVar8 = (AddressTableEntry *)0x0;
        root = (ZoneTreeNode *)0x0;
        while( true ) {
          pAVar6 = pAVar8;
          if (pAVar9 == (AddressTableEntry *)0x0) {
            *(ulong *)(pAVar6 + uVar4 * 8) =
                 (ulong)((uint)*(undefined8 *)(pAVar6 + uVar4 * 8) & 1) | (ulong)node;
            pAVar8 = node;
          }
          else {
            pbVar5 = (byte *)(*(ulong *)pAVar9 & 0xfffffffffffffffe);
            pAVar8 = pAVar9;
            if ((((pbVar5 != (byte *)0x0) && ((*pbVar5 & 1) != 0)) &&
                (*(byte **)(pAVar9 + 8) != (byte *)0x0)) && ((**(byte **)(pAVar9 + 8) & 1) != 0)) {
              *(ulong *)pAVar9 = *(ulong *)pAVar9 | 1;
              *pbVar5 = *pbVar5 & 0xfe;
              **(ulong **)(pAVar9 + 8) = **(ulong **)(pAVar9 + 8) & 0xfffffffffffffffe;
            }
          }
          if (((pAVar6 != (AddressTableEntry *)0x0) && ((*(ulong *)pAVar8 & 1) != 0)) &&
             (((byte)*pAVar6 & 1) != 0)) {
            pZVar1 = *(ZoneTreeNode **)(pZVar7 + 8);
            if (pAVar8 == (AddressTableEntry *)(*(ulong *)(pAVar6 + uVar2 * 8) & 0xfffffffffffffffe)
               ) {
              pZVar3 = _singleRotate(root,(ulong)(uVar2 == 0));
            }
            else {
              pZVar3 = _doubleRotate(root,(ulong)(uVar2 == 0));
            }
            *(ulong *)(pZVar7 + (ulong)(root == pZVar1) * 8) =
                 (ulong)((uint)*(undefined8 *)(pZVar7 + (ulong)(root == pZVar1) * 8) & 1) |
                 (ulong)pZVar3;
          }
          if (pAVar8 == node) break;
          if (root != (ZoneTreeNode *)0x0) {
            pZVar7 = root;
          }
          pAVar9 = (AddressTableEntry *)
                   (*(ulong *)(pAVar8 + (ulong)(*(ulong *)(pAVar8 + 0x10) < *(ulong *)(node + 0x10))
                                        * 8) & 0xfffffffffffffffe);
          uVar2 = uVar4;
          uVar4 = (ulong)(*(ulong *)(pAVar8 + 0x10) < *(ulong *)(node + 0x10));
          root = (ZoneTreeNode *)pAVar6;
        }
        *(AddressTableEntry **)this = local_38;
        *local_38 = (AddressTableEntry)((byte)*local_38 & 0xfe);
      }
      return;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/../core/zonetree.h"
               ,0x98,"!node->isRed()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/../core/zonetree.h"
             ,0x97,"!node->hasRight()");
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }